

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O1

uint unfilter(uchar *out,uchar *in,uint w,uint h,uint bpp)

{
  ulong uVar1;
  uchar uVar2;
  uchar uVar3;
  uchar uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  uint uVar11;
  uchar *puVar12;
  ulong uVar13;
  ulong uVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  uchar *puVar19;
  ulong uVar20;
  byte bVar21;
  byte bVar22;
  uint uVar23;
  ulong uVar24;
  uchar *puVar25;
  byte bVar26;
  byte bVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  uchar *puVar32;
  byte bVar33;
  uint uVar34;
  uint uVar35;
  long lVar36;
  long lVar37;
  uchar *puVar38;
  byte bVar39;
  uchar *puVar40;
  long lVar41;
  uchar *puVar42;
  uint uVar43;
  uchar *puVar44;
  ulong uVar45;
  long lVar46;
  long lVar47;
  uint uVar48;
  uchar *puVar49;
  uint uVar50;
  uint uVar51;
  uint uVar52;
  uchar *puVar53;
  byte bVar54;
  long lVar55;
  uchar *puVar56;
  uint local_114;
  uint local_f4;
  uint local_e8;
  
  if (h == 0) {
    return 0;
  }
  uVar11 = bpp + 7;
  uVar31 = (ulong)(uVar11 >> 3);
  lVar36 = (ulong)bpp * (ulong)(w >> 3);
  uVar24 = (ulong)((w & 7) * bpp + 7 >> 3);
  uVar1 = lVar36 + uVar24;
  lVar47 = lVar36 + uVar24 + 1;
  puVar56 = in + 1;
  lVar55 = (long)out - uVar31;
  lVar37 = (lVar36 + uVar24) - uVar31;
  puVar25 = out + 1;
  puVar49 = in + 2;
  puVar53 = out + 2;
  puVar44 = in + 3;
  puVar40 = out + 3;
  puVar38 = in + 4;
  puVar12 = out + uVar31;
  puVar19 = in + uVar31 + 1;
  uVar20 = 0;
  puVar42 = (uchar *)0x0;
  puVar32 = out;
  do {
    switch(in[lVar47 * uVar20]) {
    case '\0':
      uVar48 = 0;
      bVar9 = true;
      if (uVar1 != 0) {
        uVar13 = 0;
        do {
          puVar32[uVar13] = puVar56[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
        break;
      }
      goto LAB_001231e0;
    case '\x01':
      if (7 < uVar11) {
        uVar13 = 0;
        do {
          puVar32[uVar13] = puVar56[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar31 != uVar13);
      }
      if (uVar1 != uVar31) {
        lVar46 = 0;
        do {
          puVar12[lVar46] = puVar32[lVar46] + puVar19[lVar46];
          lVar46 = lVar46 + 1;
        } while (lVar37 != lVar46);
      }
      break;
    case '\x02':
      if (puVar42 == (uchar *)0x0) {
        uVar48 = 0;
        bVar9 = true;
        if (uVar1 == 0) goto LAB_001231e0;
        uVar13 = 0;
        do {
          puVar32[uVar13] = puVar56[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
      else if (uVar1 != 0) {
        uVar13 = 0;
        do {
          puVar32[uVar13] = puVar42[uVar13] + puVar56[uVar13];
          uVar13 = uVar13 + 1;
        } while (uVar1 != uVar13);
      }
      break;
    case '\x03':
      if (puVar42 == (uchar *)0x0) {
        if (7 < uVar11) {
          uVar13 = 0;
          do {
            puVar32[uVar13] = puVar56[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar31 != uVar13);
        }
        if (uVar1 != uVar31) {
          lVar46 = 0;
          do {
            puVar12[lVar46] = (puVar32[lVar46] >> 1) + puVar19[lVar46];
            lVar46 = lVar46 + 1;
          } while (lVar37 != lVar46);
        }
      }
      else {
        if (uVar11 < 8) {
          uVar45 = 0;
        }
        else {
          uVar13 = 0;
          do {
            puVar32[uVar13] = (puVar42[uVar13] >> 1) + puVar56[uVar13];
            uVar13 = uVar13 + 1;
            uVar45 = uVar31;
          } while (uVar31 != uVar13);
        }
        if (uVar11 < 0x20) {
          if (uVar11 >> 3 != 3) {
            if ((uVar11 < 0x10) || (uVar1 <= uVar45 + 1)) goto LAB_0012315e;
            lVar46 = 0;
            do {
              bVar33 = puVar32[lVar46 + 1];
              bVar15 = puVar42[lVar46 + uVar45 + 1];
              uVar2 = puVar49[lVar46 + uVar45];
              puVar25[lVar46 + (uVar45 - 1)] =
                   (char)((uint)puVar42[lVar46 + uVar45] + (uint)puVar32[lVar46] >> 1) +
                   puVar49[lVar46 + (uVar45 - 1)];
              puVar25[lVar46 + uVar45] = (char)((uint)bVar15 + (uint)bVar33 >> 1) + uVar2;
              lVar41 = uVar45 + lVar46;
              lVar46 = lVar46 + 2;
            } while (lVar41 + 3U < uVar1);
            goto LAB_00123152;
          }
          if (uVar45 + 2 < uVar1) {
            lVar46 = 0;
            do {
              bVar33 = puVar32[lVar46 + 1];
              bVar15 = puVar32[lVar46 + 2];
              bVar16 = puVar42[lVar46 + uVar45 + 1];
              bVar17 = puVar42[lVar46 + uVar45 + 2];
              uVar2 = puVar44[lVar46 + (uVar45 - 1)];
              uVar3 = puVar44[lVar46 + uVar45];
              puVar53[lVar46 + (uVar45 - 2)] =
                   (char)((uint)puVar42[lVar46 + uVar45] + (uint)puVar32[lVar46] >> 1) +
                   puVar44[lVar46 + (uVar45 - 2)];
              puVar53[lVar46 + (uVar45 - 1)] = (char)((uint)bVar16 + (uint)bVar33 >> 1) + uVar2;
              puVar53[lVar46 + uVar45] = (char)((uint)bVar17 + (uint)bVar15 >> 1) + uVar3;
              lVar41 = uVar45 + lVar46;
              lVar46 = lVar46 + 3;
            } while (lVar41 + 5U < uVar1);
            goto LAB_00123152;
          }
LAB_0012315e:
          lVar46 = 0;
        }
        else {
          if (uVar1 <= uVar45 + 3) goto LAB_0012315e;
          lVar46 = 0;
          do {
            bVar33 = puVar32[lVar46 + 1];
            bVar15 = puVar32[lVar46 + 2];
            bVar16 = puVar32[lVar46 + 3];
            bVar17 = puVar42[lVar46 + uVar45 + 1];
            bVar21 = puVar42[lVar46 + uVar45 + 2];
            uVar2 = puVar38[lVar46 + (uVar45 - 2)];
            bVar39 = puVar42[lVar46 + uVar45 + 3];
            uVar3 = puVar38[lVar46 + (uVar45 - 1)];
            uVar4 = puVar38[lVar46 + uVar45];
            puVar40[lVar46 + (uVar45 - 3)] =
                 (char)((uint)puVar42[lVar46 + uVar45] + (uint)puVar32[lVar46] >> 1) +
                 puVar38[lVar46 + (uVar45 - 3)];
            puVar40[lVar46 + (uVar45 - 2)] = (char)((uint)bVar17 + (uint)bVar33 >> 1) + uVar2;
            puVar40[lVar46 + (uVar45 - 1)] = (char)((uint)bVar21 + (uint)bVar15 >> 1) + uVar3;
            puVar40[lVar46 + uVar45] = (char)((uint)bVar39 + (uint)bVar16 >> 1) + uVar4;
            lVar41 = uVar45 + lVar46;
            lVar46 = lVar46 + 4;
          } while (lVar41 + 7U < uVar1);
LAB_00123152:
          uVar45 = uVar45 + lVar46;
        }
        if (uVar45 != uVar1) {
          lVar41 = 0;
          do {
            puVar32[lVar41 + uVar45] =
                 (char)((uint)puVar42[lVar41 + uVar45] + (uint)puVar32[lVar41 + lVar46] >> 1) +
                 puVar56[lVar41 + uVar45];
            lVar41 = lVar41 + 1;
          } while ((lVar36 + uVar24) - uVar45 != lVar41);
        }
      }
      break;
    case '\x04':
      if (puVar42 == (uchar *)0x0) {
        if (7 < uVar11) {
          uVar13 = 0;
          do {
            puVar32[uVar13] = puVar56[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar31 != uVar13);
        }
        if (uVar1 != uVar31) {
          lVar46 = 0;
          do {
            puVar32[lVar46 + uVar31] = puVar32[lVar46] + puVar56[lVar46 + uVar31];
            lVar46 = lVar46 + 1;
          } while (lVar37 != lVar46);
        }
      }
      else {
        switch(uVar31) {
        case 1:
          if (uVar1 == 0) {
LAB_00123ea1:
            uVar13 = 0;
          }
          else {
            bVar33 = 0;
            uVar48 = 0;
            uVar45 = 0;
            do {
              bVar16 = (byte)uVar48;
              bVar15 = puVar42[uVar45];
              uVar29 = bVar15 - uVar48;
              uVar43 = -uVar29;
              if (0 < (int)uVar29) {
                uVar43 = uVar29;
              }
              uVar30 = bVar33 - uVar48;
              uVar29 = -uVar30;
              if (0 < (int)uVar30) {
                uVar29 = uVar30;
              }
              uVar48 = (uint)bVar33 + uVar48 * -2 + (uint)bVar15;
              uVar30 = -uVar48;
              if (0 < (int)uVar48) {
                uVar30 = uVar48;
              }
              uVar48 = (uint)bVar15;
              uVar52 = uVar29 & 0xff;
              if ((uVar43 & 0xff) <= (uVar29 & 0xff)) {
                uVar52 = uVar43 & 0xff;
                bVar15 = bVar33;
              }
              if (uVar52 <= uVar30) {
                bVar16 = bVar15;
              }
              bVar33 = bVar16 + puVar56[uVar45];
              puVar32[uVar45] = bVar33;
              uVar45 = uVar45 + 1;
              uVar13 = uVar1;
            } while (uVar1 != uVar45);
          }
          break;
        case 2:
          if (uVar1 < 2) goto LAB_00123ea1;
          bVar15 = 0;
          uVar43 = 0;
          bVar33 = 0;
          uVar48 = 0;
          uVar13 = 1;
          do {
            uVar45 = uVar13;
            bVar21 = (byte)uVar43;
            bVar17 = (byte)uVar48;
            bVar16 = puVar42[uVar45 - 1];
            uVar30 = bVar16 - uVar48;
            uVar29 = -uVar30;
            if (0 < (int)uVar30) {
              uVar29 = uVar30;
            }
            uVar52 = bVar33 - uVar48;
            uVar30 = -uVar52;
            if (0 < (int)uVar52) {
              uVar30 = uVar52;
            }
            uVar48 = (uint)bVar33 + uVar48 * -2 + (uint)bVar16;
            uVar52 = -uVar48;
            if (0 < (int)uVar48) {
              uVar52 = uVar48;
            }
            uVar48 = (uint)bVar16;
            uVar23 = uVar30 & 0xff;
            if ((uVar29 & 0xff) <= (uVar30 & 0xff)) {
              uVar23 = uVar29 & 0xff;
              bVar16 = bVar33;
            }
            if (uVar23 <= uVar52) {
              bVar17 = bVar16;
            }
            bVar33 = puVar42[uVar45];
            uVar30 = bVar33 - uVar43;
            uVar29 = -uVar30;
            if (0 < (int)uVar30) {
              uVar29 = uVar30;
            }
            uVar52 = bVar15 - uVar43;
            uVar30 = -uVar52;
            if (0 < (int)uVar52) {
              uVar30 = uVar52;
            }
            uVar43 = (uint)bVar15 + uVar43 * -2 + (uint)bVar33;
            uVar52 = -uVar43;
            if (0 < (int)uVar43) {
              uVar52 = uVar43;
            }
            uVar43 = (uint)bVar33;
            uVar23 = uVar30 & 0xff;
            if ((uVar29 & 0xff) <= (uVar30 & 0xff)) {
              uVar23 = uVar29 & 0xff;
              bVar33 = bVar15;
            }
            if (uVar23 <= uVar52) {
              bVar21 = bVar33;
            }
            bVar33 = bVar17 + puVar56[uVar45 - 1];
            bVar15 = bVar21 + puVar56[uVar45];
            puVar32[uVar45 - 1] = bVar33;
            puVar32[uVar45] = bVar15;
            uVar13 = uVar45 + 2;
          } while (uVar45 + 2 < uVar1);
          uVar13 = uVar45 + 1;
          break;
        case 3:
          if (uVar1 < 3) goto LAB_00123ea1;
          bVar16 = 0;
          bVar15 = 0;
          bVar33 = 0;
          uVar45 = 0;
          uVar43 = 0;
          uVar29 = 0;
          uVar48 = 0;
          do {
            bVar17 = puVar42[uVar45];
            uVar52 = bVar17 - uVar43;
            uVar30 = -uVar52;
            if (0 < (int)uVar52) {
              uVar30 = uVar52;
            }
            uVar23 = bVar33 - uVar43;
            uVar52 = -uVar23;
            if (0 < (int)uVar23) {
              uVar52 = uVar23;
            }
            uVar18 = (uint)bVar33 + uVar43 * -2 + (uint)bVar17;
            uVar23 = -uVar18;
            if (0 < (int)uVar18) {
              uVar23 = uVar18;
            }
            uVar18 = uVar52 & 0xff;
            bVar21 = bVar17;
            if ((uVar30 & 0xff) <= (uVar52 & 0xff)) {
              uVar18 = uVar30 & 0xff;
              bVar21 = bVar33;
            }
            bVar33 = (byte)uVar43;
            if (uVar18 <= uVar23) {
              bVar33 = bVar21;
            }
            bVar21 = puVar42[uVar45 + 1];
            uVar30 = bVar21 - uVar29;
            uVar43 = -uVar30;
            if (0 < (int)uVar30) {
              uVar43 = uVar30;
            }
            uVar52 = bVar15 - uVar29;
            uVar30 = -uVar52;
            if (0 < (int)uVar52) {
              uVar30 = uVar52;
            }
            uVar23 = (uint)bVar15 + uVar29 * -2 + (uint)bVar21;
            uVar52 = -uVar23;
            if (0 < (int)uVar23) {
              uVar52 = uVar23;
            }
            uVar23 = uVar30 & 0xff;
            bVar39 = bVar21;
            if ((uVar43 & 0xff) <= (uVar30 & 0xff)) {
              uVar23 = uVar43 & 0xff;
              bVar39 = bVar15;
            }
            bVar15 = (byte)uVar29;
            if (uVar23 <= uVar52) {
              bVar15 = bVar39;
            }
            bVar39 = puVar42[uVar45 + 2];
            uVar29 = bVar39 - uVar48;
            uVar43 = -uVar29;
            if (0 < (int)uVar29) {
              uVar43 = uVar29;
            }
            uVar30 = bVar16 - uVar48;
            uVar29 = -uVar30;
            if (0 < (int)uVar30) {
              uVar29 = uVar30;
            }
            uVar52 = (uint)bVar16 + uVar48 * -2 + (uint)bVar39;
            uVar30 = -uVar52;
            if (0 < (int)uVar52) {
              uVar30 = uVar52;
            }
            uVar52 = uVar29 & 0xff;
            bVar27 = bVar39;
            if ((uVar43 & 0xff) <= (uVar29 & 0xff)) {
              uVar52 = uVar43 & 0xff;
              bVar27 = bVar16;
            }
            bVar16 = (byte)uVar48;
            if (uVar52 <= uVar30) {
              bVar16 = bVar27;
            }
            bVar33 = bVar33 + puVar56[uVar45];
            bVar15 = bVar15 + puVar56[uVar45 + 1];
            bVar16 = bVar16 + puVar56[uVar45 + 2];
            puVar32[uVar45] = bVar33;
            puVar32[uVar45 + 1] = bVar15;
            puVar32[uVar45 + 2] = bVar16;
            uVar13 = uVar45 + 3;
            uVar14 = uVar45 + 5;
            uVar45 = uVar13;
            uVar43 = (uint)bVar17;
            uVar29 = (uint)bVar21;
            uVar48 = (uint)bVar39;
          } while (uVar14 < uVar1);
          break;
        case 4:
          if (uVar1 < 4) goto LAB_00123ea1;
          uVar23 = 0;
          uVar48 = 0;
          bVar33 = 0;
          bVar15 = 0;
          uVar13 = 3;
          uVar29 = 0;
          uVar30 = 0;
          uVar52 = 0;
          uVar43 = 0;
          do {
            uVar45 = uVar13;
            uVar50 = (uint)puVar42[uVar45 - 3];
            uVar34 = uVar50 - uVar43;
            uVar18 = -uVar34;
            if (0 < (int)uVar34) {
              uVar18 = uVar34;
            }
            uVar28 = bVar15 - uVar43;
            uVar34 = -uVar28;
            if (0 < (int)uVar28) {
              uVar34 = uVar28;
            }
            uVar51 = (uint)bVar15 + uVar43 * -2 + (uint)puVar42[uVar45 - 3];
            uVar28 = -uVar51;
            if (0 < (int)uVar51) {
              uVar28 = uVar51;
            }
            uVar51 = uVar50;
            uVar35 = uVar34 & 0xff;
            if ((uVar18 & 0xff) <= (uVar34 & 0xff)) {
              uVar51 = (uint)bVar15;
              uVar35 = uVar18 & 0xff;
            }
            if (uVar35 <= uVar28) {
              uVar43 = uVar51;
            }
            bVar16 = puVar42[uVar45 - 2];
            uVar34 = bVar16 - uVar52;
            uVar18 = -uVar34;
            if (0 < (int)uVar34) {
              uVar18 = uVar34;
            }
            uVar28 = bVar33 - uVar52;
            uVar34 = -uVar28;
            if (0 < (int)uVar28) {
              uVar34 = uVar28;
            }
            uVar51 = (uint)bVar33 + uVar52 * -2 + (uint)bVar16;
            uVar28 = -uVar51;
            if (0 < (int)uVar51) {
              uVar28 = uVar51;
            }
            uVar51 = uVar34 & 0xff;
            bVar15 = bVar16;
            if ((uVar18 & 0xff) <= (uVar34 & 0xff)) {
              uVar51 = uVar18 & 0xff;
              bVar15 = bVar33;
            }
            bVar33 = (byte)uVar52;
            if (uVar51 <= uVar28) {
              bVar33 = bVar15;
            }
            bVar17 = puVar42[uVar45 - 1];
            uVar18 = bVar17 - uVar29;
            uVar52 = -uVar18;
            if (0 < (int)uVar18) {
              uVar52 = uVar18;
            }
            uVar34 = uVar48 - uVar29;
            uVar18 = -uVar34;
            if (0 < (int)uVar34) {
              uVar18 = uVar34;
            }
            uVar28 = uVar48 + uVar29 * -2 + (uint)bVar17;
            uVar34 = -uVar28;
            if (0 < (int)uVar28) {
              uVar34 = uVar28;
            }
            uVar28 = uVar18 & 0xff;
            bVar15 = bVar17;
            if ((uVar52 & 0xff) <= (uVar18 & 0xff)) {
              uVar28 = uVar52 & 0xff;
              bVar15 = (byte)uVar48;
            }
            bVar21 = (byte)uVar29;
            if (uVar28 <= uVar34) {
              bVar21 = bVar15;
            }
            uVar52 = (uint)puVar42[uVar45];
            uVar29 = uVar52 - uVar30;
            uVar48 = -uVar29;
            if (0 < (int)uVar29) {
              uVar48 = uVar29;
            }
            uVar18 = uVar23 - uVar30;
            uVar29 = -uVar18;
            if (0 < (int)uVar18) {
              uVar29 = uVar18;
            }
            uVar34 = uVar23 + uVar30 * -2 + uVar52;
            uVar18 = -uVar34;
            if (0 < (int)uVar34) {
              uVar18 = uVar34;
            }
            uVar34 = uVar29 & 0xff;
            bVar15 = puVar42[uVar45];
            if ((uVar48 & 0xff) <= (uVar29 & 0xff)) {
              uVar34 = uVar48 & 0xff;
              bVar15 = (byte)uVar23;
            }
            bVar39 = (byte)uVar30;
            if (uVar34 <= uVar18) {
              bVar39 = bVar15;
            }
            bVar15 = (char)uVar43 + puVar56[uVar45 - 3];
            bVar33 = bVar33 + puVar56[uVar45 - 2];
            uVar2 = puVar56[uVar45 - 1];
            uVar48 = (uint)(byte)(bVar21 + uVar2);
            uVar3 = puVar56[uVar45];
            puVar32[uVar45 - 3] = bVar15;
            puVar32[uVar45 - 2] = bVar33;
            puVar32[uVar45 - 1] = bVar21 + uVar2;
            puVar32[uVar45] = bVar39 + uVar3;
            uVar23 = (uint)(byte)(bVar39 + uVar3);
            uVar13 = uVar45 + 4;
            uVar29 = (uint)bVar17;
            uVar30 = uVar52;
            uVar52 = (uint)bVar16;
            uVar43 = uVar50;
          } while (uVar45 + 4 < uVar1);
          uVar13 = uVar45 + 1;
          break;
        default:
          uVar13 = 0;
          do {
            puVar32[uVar13] = puVar42[uVar13] + puVar56[uVar13];
            uVar13 = uVar13 + 1;
          } while (uVar31 != uVar13);
        case 0:
          uVar13 = uVar31;
          break;
        case 6:
          if (uVar1 < 6) goto LAB_00123ea1;
          bVar39 = 0;
          bVar17 = 0;
          bVar27 = 0;
          bVar16 = 0;
          bVar33 = 0;
          bVar15 = 0;
          uVar13 = 5;
          uVar43 = 0;
          uVar29 = 0;
          uVar30 = 0;
          uVar48 = 0;
          uVar52 = 0;
          bVar21 = 0;
          do {
            uVar45 = uVar13;
            bVar5 = puVar42[uVar45 - 5];
            uVar18 = bVar5 - uVar48;
            uVar23 = -uVar18;
            if (0 < (int)uVar18) {
              uVar23 = uVar18;
            }
            uVar34 = bVar27 - uVar48;
            uVar18 = -uVar34;
            if (0 < (int)uVar34) {
              uVar18 = uVar34;
            }
            uVar50 = (uint)bVar27 + uVar48 * -2 + (uint)bVar5;
            uVar34 = -uVar50;
            if (0 < (int)uVar50) {
              uVar34 = uVar50;
            }
            uVar50 = uVar18 & 0xff;
            uVar28 = (uint)bVar5;
            if ((uVar23 & 0xff) <= (uVar18 & 0xff)) {
              uVar28 = (uint)bVar27;
              uVar50 = uVar23 & 0xff;
            }
            if (uVar50 <= uVar34) {
              uVar48 = uVar28;
            }
            uVar34 = (uint)puVar42[uVar45 - 4];
            uVar18 = uVar34 - uVar52;
            uVar23 = -uVar18;
            if (0 < (int)uVar18) {
              uVar23 = uVar18;
            }
            uVar50 = bVar33 - uVar52;
            uVar18 = -uVar50;
            if (0 < (int)uVar50) {
              uVar18 = uVar50;
            }
            uVar28 = (uint)bVar33 + uVar52 * -2 + (uint)puVar42[uVar45 - 4];
            uVar50 = -uVar28;
            if (0 < (int)uVar28) {
              uVar50 = uVar28;
            }
            uVar28 = uVar18 & 0xff;
            uVar51 = uVar34;
            if ((uVar23 & 0xff) <= (uVar18 & 0xff)) {
              uVar51 = (uint)bVar33;
              uVar28 = uVar23 & 0xff;
            }
            if (uVar28 <= uVar50) {
              uVar52 = uVar51;
            }
            bVar26 = puVar42[uVar45 - 3];
            uVar18 = bVar26 - uVar29;
            uVar23 = -uVar18;
            if (0 < (int)uVar18) {
              uVar23 = uVar18;
            }
            uVar50 = bVar15 - uVar29;
            uVar18 = -uVar50;
            if (0 < (int)uVar50) {
              uVar18 = uVar50;
            }
            uVar28 = (uint)bVar15 + uVar29 * -2 + (uint)bVar26;
            uVar50 = -uVar28;
            if (0 < (int)uVar28) {
              uVar50 = uVar28;
            }
            uVar28 = uVar18 & 0xff;
            bVar33 = bVar26;
            if ((uVar23 & 0xff) <= (uVar18 & 0xff)) {
              uVar28 = uVar23 & 0xff;
              bVar33 = bVar15;
            }
            bVar15 = (byte)uVar29;
            if (uVar28 <= uVar50) {
              bVar15 = bVar33;
            }
            bVar6 = puVar42[uVar45 - 2];
            uVar23 = bVar6 - uVar30;
            uVar29 = -uVar23;
            if (0 < (int)uVar23) {
              uVar29 = uVar23;
            }
            uVar18 = bVar16 - uVar30;
            uVar23 = -uVar18;
            if (0 < (int)uVar18) {
              uVar23 = uVar18;
            }
            uVar50 = (uint)bVar16 + uVar30 * -2 + (uint)bVar6;
            uVar18 = -uVar50;
            if (0 < (int)uVar50) {
              uVar18 = uVar50;
            }
            uVar50 = uVar23 & 0xff;
            bVar33 = bVar6;
            if ((uVar29 & 0xff) <= (uVar23 & 0xff)) {
              uVar50 = uVar29 & 0xff;
              bVar33 = bVar16;
            }
            bVar16 = (byte)uVar30;
            if (uVar50 <= uVar18) {
              bVar16 = bVar33;
            }
            uVar23 = (uint)puVar42[uVar45 - 1];
            uVar30 = uVar23 - uVar43;
            uVar29 = -uVar30;
            if (0 < (int)uVar30) {
              uVar29 = uVar30;
            }
            uVar18 = bVar17 - uVar43;
            uVar30 = -uVar18;
            if (0 < (int)uVar18) {
              uVar30 = uVar18;
            }
            uVar50 = (uint)bVar17 + uVar43 * -2 + uVar23;
            uVar18 = -uVar50;
            if (0 < (int)uVar50) {
              uVar18 = uVar50;
            }
            uVar50 = uVar30 & 0xff;
            bVar33 = puVar42[uVar45 - 1];
            if ((uVar29 & 0xff) <= (uVar30 & 0xff)) {
              uVar50 = uVar29 & 0xff;
              bVar33 = bVar17;
            }
            bVar17 = (byte)uVar43;
            if (uVar50 <= uVar18) {
              bVar17 = bVar33;
            }
            bVar27 = (char)uVar48 + puVar56[uVar45 - 5];
            bVar33 = (char)uVar52 + puVar56[uVar45 - 4];
            bVar15 = bVar15 + puVar56[uVar45 - 3];
            bVar16 = bVar16 + puVar56[uVar45 - 2];
            bVar17 = bVar17 + puVar56[uVar45 - 1];
            bVar7 = puVar42[uVar45];
            uVar43 = (uint)bVar7 - (uint)bVar21;
            uVar48 = -uVar43;
            if (0 < (int)uVar43) {
              uVar48 = uVar43;
            }
            uVar29 = (uint)bVar39 - (uint)bVar21;
            uVar43 = -uVar29;
            if (0 < (int)uVar29) {
              uVar43 = uVar29;
            }
            uVar30 = (uint)bVar39 + (uint)bVar21 * -2 + (uint)bVar7;
            uVar29 = -uVar30;
            if (0 < (int)uVar30) {
              uVar29 = uVar30;
            }
            uVar30 = uVar43 & 0xff;
            bVar10 = bVar7;
            if ((uVar48 & 0xff) <= (uVar43 & 0xff)) {
              uVar30 = uVar48 & 0xff;
              bVar10 = bVar39;
            }
            if (uVar30 <= uVar29) {
              bVar21 = bVar10;
            }
            bVar39 = bVar21 + puVar56[uVar45];
            puVar32[uVar45 - 5] = bVar27;
            puVar32[uVar45 - 4] = bVar33;
            puVar32[uVar45 - 3] = bVar15;
            puVar32[uVar45 - 2] = bVar16;
            puVar32[uVar45 - 1] = bVar17;
            puVar32[uVar45] = bVar39;
            uVar13 = uVar45 + 6;
            uVar43 = uVar23;
            uVar29 = (uint)bVar26;
            uVar30 = (uint)bVar6;
            uVar48 = (uint)bVar5;
            uVar52 = uVar34;
            bVar21 = bVar7;
          } while (uVar45 + 6 < uVar1);
          uVar13 = uVar45 + 1;
          break;
        case 8:
          if (uVar1 < 8) goto LAB_00123ea1;
          uVar23 = 0;
          bVar33 = 0;
          bVar15 = 0;
          local_e8 = 0;
          bVar16 = 0;
          local_f4 = 0;
          bVar17 = 0;
          bVar21 = 0;
          local_114 = 0;
          bVar27 = 0;
          uVar13 = 7;
          uVar48 = 0;
          uVar43 = 0;
          uVar29 = 0;
          uVar30 = 0;
          uVar52 = 0;
          bVar39 = 0;
          do {
            uVar45 = uVar13;
            uVar50 = (uint)puVar42[uVar45 - 7];
            uVar34 = uVar50 - uVar30;
            uVar18 = -uVar34;
            if (0 < (int)uVar34) {
              uVar18 = uVar34;
            }
            uVar28 = uVar23 - uVar30;
            uVar34 = -uVar28;
            if (0 < (int)uVar28) {
              uVar34 = uVar28;
            }
            uVar51 = uVar23 + uVar30 * -2 + (uint)puVar42[uVar45 - 7];
            uVar28 = -uVar51;
            if (0 < (int)uVar51) {
              uVar28 = uVar51;
            }
            uVar51 = uVar50;
            uVar35 = uVar34 & 0xff;
            if ((uVar18 & 0xff) <= (uVar34 & 0xff)) {
              uVar51 = uVar23;
              uVar35 = uVar18 & 0xff;
            }
            if (uVar35 <= uVar28) {
              uVar30 = uVar51;
            }
            bVar5 = puVar42[uVar45 - 6];
            uVar18 = bVar5 - uVar29;
            uVar23 = -uVar18;
            if (0 < (int)uVar18) {
              uVar23 = uVar18;
            }
            uVar34 = bVar33 - uVar29;
            uVar18 = -uVar34;
            if (0 < (int)uVar34) {
              uVar18 = uVar34;
            }
            uVar28 = (uint)bVar33 + uVar29 * -2 + (uint)bVar5;
            uVar34 = -uVar28;
            if (0 < (int)uVar28) {
              uVar34 = uVar28;
            }
            uVar28 = uVar18 & 0xff;
            bVar26 = bVar5;
            if ((uVar23 & 0xff) <= (uVar18 & 0xff)) {
              uVar28 = uVar23 & 0xff;
              bVar26 = bVar33;
            }
            bVar33 = (byte)uVar29;
            if (uVar28 <= uVar34) {
              bVar33 = bVar26;
            }
            uVar18 = (uint)puVar42[uVar45 - 5];
            uVar23 = uVar18 - uVar52;
            uVar29 = -uVar23;
            if (0 < (int)uVar23) {
              uVar29 = uVar23;
            }
            uVar34 = bVar15 - uVar52;
            uVar23 = -uVar34;
            if (0 < (int)uVar34) {
              uVar23 = uVar34;
            }
            uVar28 = (uint)bVar15 + uVar52 * -2 + (uint)puVar42[uVar45 - 5];
            uVar34 = -uVar28;
            if (0 < (int)uVar28) {
              uVar34 = uVar28;
            }
            uVar28 = uVar23 & 0xff;
            uVar51 = uVar18;
            if ((uVar29 & 0xff) <= (uVar23 & 0xff)) {
              uVar51 = (uint)bVar15;
              uVar28 = uVar29 & 0xff;
            }
            if (uVar28 <= uVar34) {
              uVar52 = uVar51;
            }
            bVar26 = puVar42[uVar45 - 4];
            uVar23 = bVar26 - local_e8;
            uVar29 = -uVar23;
            if (0 < (int)uVar23) {
              uVar29 = uVar23;
            }
            uVar34 = bVar16 - local_e8;
            uVar23 = -uVar34;
            if (0 < (int)uVar34) {
              uVar23 = uVar34;
            }
            uVar28 = (uint)bVar16 + local_e8 * -2 + (uint)bVar26;
            uVar34 = -uVar28;
            if (0 < (int)uVar28) {
              uVar34 = uVar28;
            }
            uVar28 = uVar23 & 0xff;
            bVar15 = bVar26;
            if ((uVar29 & 0xff) <= (uVar23 & 0xff)) {
              uVar28 = uVar29 & 0xff;
              bVar15 = bVar16;
            }
            bVar16 = (byte)local_e8;
            if (uVar28 <= uVar34) {
              bVar16 = bVar15;
            }
            bVar6 = puVar42[uVar45 - 3];
            uVar23 = bVar6 - local_f4;
            uVar29 = -uVar23;
            if (0 < (int)uVar23) {
              uVar29 = uVar23;
            }
            uVar34 = bVar17 - local_f4;
            uVar23 = -uVar34;
            if (0 < (int)uVar34) {
              uVar23 = uVar34;
            }
            uVar28 = (uint)bVar17 + local_f4 * -2 + (uint)bVar6;
            uVar34 = -uVar28;
            if (0 < (int)uVar28) {
              uVar34 = uVar28;
            }
            uVar28 = uVar23 & 0xff;
            bVar15 = bVar6;
            if ((uVar29 & 0xff) <= (uVar23 & 0xff)) {
              uVar28 = uVar29 & 0xff;
              bVar15 = bVar17;
            }
            bVar17 = (byte)local_f4;
            if (uVar28 <= uVar34) {
              bVar17 = bVar15;
            }
            bVar10 = (char)uVar30 + puVar56[uVar45 - 7];
            uVar23 = (uint)bVar10;
            bVar33 = bVar33 + puVar56[uVar45 - 6];
            bVar15 = (char)uVar52 + puVar56[uVar45 - 5];
            bVar16 = bVar16 + puVar56[uVar45 - 4];
            bVar7 = puVar42[uVar45 - 2];
            bVar17 = bVar17 + puVar56[uVar45 - 3];
            uVar52 = (uint)puVar42[uVar45 - 1];
            uVar30 = bVar7 - uVar48;
            uVar29 = -uVar30;
            if (0 < (int)uVar30) {
              uVar29 = uVar30;
            }
            uVar34 = bVar21 - uVar48;
            uVar30 = -uVar34;
            if (0 < (int)uVar34) {
              uVar30 = uVar34;
            }
            bVar8 = puVar42[uVar45];
            uVar28 = (uint)bVar21 + uVar48 * -2 + (uint)bVar7;
            uVar34 = -uVar28;
            if (0 < (int)uVar28) {
              uVar34 = uVar28;
            }
            uVar28 = uVar30 & 0xff;
            bVar54 = bVar7;
            if ((uVar29 & 0xff) <= (uVar30 & 0xff)) {
              uVar28 = uVar29 & 0xff;
              bVar54 = bVar21;
            }
            bVar21 = (byte)uVar48;
            if (uVar28 <= uVar34) {
              bVar21 = bVar54;
            }
            bVar21 = bVar21 + puVar56[uVar45 - 2];
            uVar29 = uVar52 - uVar43;
            uVar48 = -uVar29;
            if (0 < (int)uVar29) {
              uVar48 = uVar29;
            }
            uVar30 = local_114 - uVar43;
            uVar29 = -uVar30;
            if (0 < (int)uVar30) {
              uVar29 = uVar30;
            }
            uVar34 = local_114 + uVar43 * -2 + uVar52;
            uVar30 = -uVar34;
            if (0 < (int)uVar34) {
              uVar30 = uVar34;
            }
            uVar34 = uVar29 & 0xff;
            bVar54 = puVar42[uVar45 - 1];
            if ((uVar48 & 0xff) <= (uVar29 & 0xff)) {
              uVar34 = uVar48 & 0xff;
              bVar54 = (byte)local_114;
            }
            bVar22 = (byte)uVar43;
            if (uVar34 <= uVar30) {
              bVar22 = bVar54;
            }
            uVar2 = puVar56[uVar45 - 1];
            local_114 = (uint)(byte)(bVar22 + uVar2);
            uVar43 = (uint)bVar8 - (uint)bVar39;
            uVar48 = -uVar43;
            if (0 < (int)uVar43) {
              uVar48 = uVar43;
            }
            uVar29 = (uint)bVar27 - (uint)bVar39;
            uVar43 = -uVar29;
            if (0 < (int)uVar29) {
              uVar43 = uVar29;
            }
            uVar30 = (uint)bVar27 + (uint)bVar39 * -2 + (uint)bVar8;
            uVar29 = -uVar30;
            if (0 < (int)uVar30) {
              uVar29 = uVar30;
            }
            uVar30 = uVar43 & 0xff;
            bVar54 = bVar8;
            if ((uVar48 & 0xff) <= (uVar43 & 0xff)) {
              uVar30 = uVar48 & 0xff;
              bVar54 = bVar27;
            }
            if (uVar30 <= uVar29) {
              bVar39 = bVar54;
            }
            bVar27 = bVar39 + puVar56[uVar45];
            puVar32[uVar45 - 7] = bVar10;
            puVar32[uVar45 - 6] = bVar33;
            puVar32[uVar45 - 5] = bVar15;
            puVar32[uVar45 - 4] = bVar16;
            puVar32[uVar45 - 3] = bVar17;
            puVar32[uVar45 - 2] = bVar21;
            puVar32[uVar45 - 1] = bVar22 + uVar2;
            puVar32[uVar45] = bVar27;
            uVar13 = uVar45 + 8;
            uVar48 = (uint)bVar7;
            uVar43 = uVar52;
            uVar29 = (uint)bVar5;
            local_f4 = (uint)bVar6;
            local_e8 = (uint)bVar26;
            uVar30 = uVar50;
            uVar52 = uVar18;
            bVar39 = bVar8;
          } while (uVar45 + 8 < uVar1);
          uVar13 = uVar45 + 1;
        }
        for (; uVar13 != uVar1; uVar13 = uVar13 + 1) {
          bVar33 = puVar42[uVar13];
          bVar15 = puVar42[uVar13 - uVar31];
          uVar43 = (uint)bVar33 - (uint)bVar15;
          uVar48 = -uVar43;
          if (0 < (int)uVar43) {
            uVar48 = uVar43;
          }
          bVar16 = *(byte *)(lVar55 + uVar13);
          uVar48 = uVar48 & 0xff;
          uVar29 = (uint)bVar16 - (uint)bVar15;
          uVar43 = -uVar29;
          if (0 < (int)uVar29) {
            uVar43 = uVar29;
          }
          uVar30 = (uint)bVar33 + (uint)bVar16 + (uint)bVar15 * -2;
          uVar29 = -uVar30;
          if (0 < (int)uVar30) {
            uVar29 = uVar30;
          }
          if ((uVar43 & 0xff) < uVar48) {
            bVar16 = bVar33;
            uVar48 = uVar43 & 0xff;
          }
          if (uVar29 < uVar48) {
            bVar16 = bVar15;
          }
          puVar32[uVar13] = bVar16 + puVar56[uVar13];
        }
      }
      break;
    default:
      bVar9 = false;
      uVar48 = 0x24;
      goto LAB_001231e0;
    }
    bVar9 = true;
    uVar48 = 0;
LAB_001231e0:
    if (!bVar9) {
      return uVar48;
    }
    puVar42 = out + uVar1 * uVar20;
    uVar20 = uVar20 + 1;
    puVar32 = puVar32 + uVar1;
    puVar56 = puVar56 + lVar47;
    lVar55 = lVar55 + uVar1;
    puVar25 = puVar25 + uVar1;
    puVar49 = puVar49 + lVar47;
    puVar53 = puVar53 + uVar1;
    puVar44 = puVar44 + lVar47;
    puVar40 = puVar40 + uVar1;
    puVar38 = puVar38 + lVar47;
    puVar12 = puVar12 + uVar1;
    puVar19 = puVar19 + lVar47;
    if (uVar20 == h) {
      return 0;
    }
  } while( true );
}

Assistant:

static unsigned unfilter(unsigned char* out, const unsigned char* in, unsigned w, unsigned h, unsigned bpp) {
  /*
  For PNG filter method 0
  this function unfilters a single image (e.g. without interlacing this is called once, with Adam7 seven times)
  out must have enough bytes allocated already, in must have the scanlines + 1 filtertype byte per scanline
  w and h are image dimensions or dimensions of reduced image, bpp is bits per pixel
  in and out are allowed to be the same memory address (but aren't the same size since in has the extra filter bytes)
  */

  unsigned y;
  unsigned char* prevline = 0;

  /*bytewidth is used for filtering, is 1 when bpp < 8, number of bytes per pixel otherwise*/
  size_t bytewidth = (bpp + 7u) / 8u;
  /*the width of a scanline in bytes, not including the filter type*/
  size_t linebytes = lodepng_get_raw_size_idat(w, 1, bpp) - 1u;

  for(y = 0; y < h; ++y) {
    size_t outindex = linebytes * y;
    size_t inindex = (1 + linebytes) * y; /*the extra filterbyte added to each row*/
    unsigned char filterType = in[inindex];

    CERROR_TRY_RETURN(unfilterScanline(&out[outindex], &in[inindex + 1], prevline, bytewidth, filterType, linebytes));

    prevline = &out[outindex];
  }

  return 0;
}